

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiobj_str.c
# Opt level: O0

FIOBJ fiobj_str_move(char *str,size_t len,size_t capacity)

{
  void *__dest;
  int *piVar1;
  undefined1 local_68 [4];
  undefined4 local_64;
  undefined8 local_60;
  undefined1 local_58;
  undefined1 local_57;
  undefined1 auStack_56 [14];
  fiobj_str_s *local_48;
  size_t local_40;
  code *local_38;
  size_t local_30;
  void *local_28;
  fiobj_str_s *s;
  size_t capacity_local;
  size_t len_local;
  char *str_local;
  
  s = (fiobj_str_s *)capacity;
  capacity_local = len;
  len_local = (size_t)str;
  __dest = fio_malloc(0x40);
  local_28 = __dest;
  if (__dest == (void *)0x0) {
    perror("ERROR: fiobj string couldn\'t allocate memory");
    piVar1 = __errno_location();
    exit(*piVar1);
  }
  local_68[0] = 0x28;
  local_64 = 1;
  local_60 = 0;
  local_58 = 0;
  local_57 = 0;
  memset(auStack_56,0,0xe);
  local_48 = s;
  local_40 = capacity_local;
  local_38 = fio_free;
  local_30 = len_local;
  memcpy(__dest,local_68,0x40);
  return (ulong)local_28 | 2;
}

Assistant:

FIOBJ fiobj_str_move(char *str, size_t len, size_t capacity) {
  fiobj_str_s *s = fio_malloc(sizeof(*s));
  if (!s) {
    perror("ERROR: fiobj string couldn't allocate memory");
    exit(errno);
  }
  *s = (fiobj_str_s){
      .head =
          {
              .ref = 1,
              .type = FIOBJ_T_STRING,
          },
      .str = FIO_STR_INIT_EXISTING(str, len, capacity),
  };
  return ((uintptr_t)s | FIOBJECT_STRING_FLAG);
}